

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScenePrivate::grabKeyboard(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  long lVar1;
  long lVar2;
  QGraphicsItem **ppQVar3;
  long lVar4;
  long in_RCX;
  long lVar5;
  long in_FS_OFFSET;
  QGraphicsItem *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->keyboardGrabberItems).d.size;
  if (lVar2 != 0) {
    lVar5 = -8;
    do {
      lVar1 = lVar2 * -8 + lVar5;
      if (lVar1 == -8) goto LAB_0060f668;
      in_RCX = lVar5 + 8;
      lVar4 = lVar5 + 8;
      lVar5 = in_RCX;
    } while (*(QGraphicsItem **)((long)(this->keyboardGrabberItems).d.ptr + lVar4) != item);
    in_RCX = in_RCX >> 3;
LAB_0060f668:
    if (lVar1 != -8) goto LAB_0060f675;
  }
  in_RCX = -1;
LAB_0060f675:
  if (in_RCX == -1) {
    if (lVar2 != 0) {
      local_38 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_38,UngrabKeyboard);
      sendEvent(this,(this->keyboardGrabberItems).d.ptr[(this->keyboardGrabberItems).d.size + -1],
                (QEvent *)&local_38);
      QEvent::~QEvent((QEvent *)&local_38);
    }
    local_38 = item;
    QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
              ((QPodArrayOps<QGraphicsItem*> *)&this->keyboardGrabberItems,
               (this->keyboardGrabberItems).d.size,&local_38);
    QList<QGraphicsItem_*>::end(&this->keyboardGrabberItems);
    local_38 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,GrabKeyboard);
    sendEvent(this,item,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  else {
    ppQVar3 = (this->keyboardGrabberItems).d.ptr;
    if (ppQVar3[lVar2 + -1] == item) {
      grabKeyboard();
    }
    else {
      grabKeyboard((QGraphicsScenePrivate *)(ppQVar3 + lVar2 + -1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabKeyboard(QGraphicsItem *item)
{
    if (keyboardGrabberItems.contains(item)) {
        if (keyboardGrabberItems.constLast() == item)
            qWarning("QGraphicsItem::grabKeyboard: already a keyboard grabber");
        else
            qWarning("QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p",
                     keyboardGrabberItems.constLast());
        return;
    }

    // Send ungrab event to the last grabber.
    if (!keyboardGrabberItems.isEmpty()) {
        // Just send ungrab event to current grabber.
        QEvent ungrabEvent(QEvent::UngrabKeyboard);
        sendEvent(keyboardGrabberItems.constLast(), &ungrabEvent);
    }

    keyboardGrabberItems << item;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabKeyboard);
    sendEvent(item, &grabEvent);
}